

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_file.c
# Opt level: O0

void file_handle_open(t_file_handle *x,t_symbol *file,t_symbol *smode)

{
  char *pcVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  undefined1 local_b8 [8];
  stat_conflict sb;
  int mode;
  t_symbol *smode_local;
  t_symbol *file_local;
  t_file_handle *x_local;
  
  sb.__glibc_reserved[2]._4_4_ = 0;
  if (x->x_fhptr->fh_fd < 0) {
    iVar2 = file_handle_getdefine(x);
    if (iVar2 == 0) {
      pd_error(x,"file handle: couldn\'t find file-define \'%s\'",x->x_fcname->s_name);
    }
    else {
      if ((smode != (t_symbol *)0x0) && (smode != &s_)) {
        switch(*smode->s_name) {
        case 'a':
          sb.__glibc_reserved[2]._4_4_ = 0x401;
          break;
        case 'c':
          sb.__glibc_reserved[2]._4_4_ = 0x201;
          break;
        case 'r':
          sb.__glibc_reserved[2]._4_4_ = 0;
          break;
        case 'w':
          sb.__glibc_reserved[2]._4_4_ = 1;
        }
      }
      if ((sb.__glibc_reserved[2]._4_4_ & 1) != 0) {
        sb.__glibc_reserved[2]._4_4_ = sb.__glibc_reserved[2]._4_4_ | 0x40;
      }
      iVar2 = do_file_open(x,file->s_name,sb.__glibc_reserved[2]._4_4_);
      if (-1 < iVar2) {
        iVar2 = fstat(x->x_fhptr->fh_fd,(stat *)local_b8);
        if (iVar2 == 0) {
          if (((uint)sb.st_nlink & 0xf000) == 0x4000) {
            file_handle_close(x);
            if (x->x_verbose != 0) {
              pd_error(x,"unable to open directory \'%s\' as file",file->s_name);
            }
            outlet_bang(x->x_infoout);
          }
          else {
            x->x_fhptr->fh_mode = (uint)((sb.__glibc_reserved[2]._4_4_ & 1) != 0);
          }
        }
        else {
          file_handle_close(x);
          if (x->x_verbose != 0) {
            pcVar1 = file->s_name;
            piVar3 = __errno_location();
            pcVar4 = strerror(*piVar3);
            pd_error(x,"unable to stat \'%s\': %s",pcVar1,pcVar4);
          }
          outlet_bang(x->x_infoout);
        }
      }
    }
  }
  else {
    pd_error(x,"\'open\' without prior \'close\'");
  }
  return;
}

Assistant:

static void file_handle_open(t_file_handle*x, t_symbol*file, t_symbol*smode) {
    int mode = O_RDONLY;
    if (x->x_fd>=0) {
        pd_error(x, "'open' without prior 'close'");
        return;
    }
    if(!file_handle_getdefine(x)) {
        pd_error(x, "file handle: couldn't find file-define '%s'", x->x_fcname->s_name);
        return;
    }
    if(smode && smode!=&s_) {
        switch(smode->s_name[0]) {
        case 'r': /* read */
            mode = O_RDONLY;
            break;
        case 'w': /* write */
            mode = O_WRONLY;
            break;
        case 'a': /* append */
            mode = O_WRONLY | O_APPEND;
            break;
        case 'c': /* create */
            mode = O_WRONLY | O_TRUNC;
            break;
        }
    }
    if(mode & O_WRONLY) {
        mode |= O_CREAT;
    }
    if(do_file_open(x, file->s_name, mode)>=0) {
            /* check if we haven't accidentally opened a directory */
        struct stat sb;
        if(fstat(x->x_fd, &sb)) {
            file_handle_close(x);
            if(x->x_verbose)
                pd_error(x, "unable to stat '%s': %s", file->s_name, strerror(errno));
            outlet_bang(x->x_infoout);
            return;
        }
        if(S_ISDIR(sb.st_mode)) {
            file_handle_close(x);
            if(x->x_verbose)
                pd_error(x, "unable to open directory '%s' as file", file->s_name);
            outlet_bang(x->x_infoout);
            return;
        }
        x->x_mode = (mode&O_WRONLY)?1:0;
    }
}